

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::TableImport::~TableImport(TableImport *this)

{
  TableImport *this_local;
  
  (this->super_ImportMixin<(wabt::ExternalKind)1>).super_Import._vptr_Import =
       (_func_int **)&PTR__TableImport_0039a570;
  Table::~Table(&this->table);
  ImportMixin<(wabt::ExternalKind)1>::~ImportMixin(&this->super_ImportMixin<(wabt::ExternalKind)1>);
  return;
}

Assistant:

explicit TableImport(string_view name = string_view())
      : ImportMixin<ExternalKind::Table>(), table(name) {}